

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeparser.cpp
# Opt level: O2

void __thiscall QMakeParser::message(QMakeParser *this,int type,QString *msg)

{
  QMakeParserHandler *pQVar1;
  ProFile *pPVar2;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_28;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->m_inError == false) && (pQVar1 = this->m_handler, pQVar1 != (QMakeParserHandler *)0x0))
  {
    pPVar2 = this->m_proFile;
    local_28.d = (pPVar2->m_fileName).d.d;
    local_28.ptr = (pPVar2->m_fileName).d.ptr;
    local_28.size = (pPVar2->m_fileName).d.size;
    if (local_28.d != (Data *)0x0) {
      LOCK();
      ((local_28.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_28.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    (*(code *)**(undefined8 **)pQVar1)(pQVar1,type,msg,&local_28,this->m_lineNo);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMakeParser::message(int type, const QString &msg) const
{
    if (!m_inError && m_handler)
        m_handler->message(type, msg, m_proFile->fileName(), m_lineNo);
}